

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int fits_translate_pixkeyword
              (char *inrec,char *outrec,char *(*patterns) [2],int npat,int naxis,int *colnum,
              int *pat_num,int *i,int *j,int *n,int *m,int *l,int *status)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  ushort **ppuVar4;
  int in_ECX;
  long in_RDX;
  char *in_RSI;
  char *in_RDI;
  int *in_R9;
  bool bVar5;
  bool bVar6;
  char *spat;
  int *in_stack_00000010;
  int firstfail;
  int pass;
  int pat;
  int ic;
  int ip;
  char s;
  char c;
  char oldp;
  char a;
  int lval;
  int mval;
  int nval;
  int fac;
  int val;
  int j1;
  int i1;
  int local_5c;
  int local_58;
  int local_54;
  char local_4f;
  char local_4e;
  char local_4d;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_4;
  
  local_34 = 0;
  local_38 = 0;
  local_44 = 0;
  local_48 = 0;
  local_4c = 0;
  local_4d = ' ';
  bVar6 = false;
  if (*_fac < 1) {
    if ((in_RDI == (char *)0x0) || (in_RSI == (char *)0x0)) {
      *_fac = 0x73;
      local_4 = 0x73;
    }
    else {
      *in_RSI = '\0';
      if (*in_RDI == '\0') {
        local_4 = 0;
      }
      else {
        local_4e = '\0';
        bVar3 = false;
        for (local_5c = 0; local_5c < in_ECX; local_5c = local_5c + 1) {
          pcVar2 = *(char **)(in_RDX + (long)local_5c * 0x10);
          local_34 = 0;
          local_38 = 0;
          local_4d = ' ';
          bVar6 = false;
          if (*pcVar2 == '*') {
            bVar6 = true;
            break;
          }
          if ((!bVar3) || (*pcVar2 != local_4e)) {
            local_4e = *pcVar2;
            local_54 = 0;
            bVar3 = true;
            for (local_58 = 0; pcVar2[local_54] != '\0' && local_58 < 8; local_58 = local_58 + 1) {
              local_4f = in_RDI[local_58];
              cVar1 = pcVar2[local_54];
              if (cVar1 == 'i') {
                ppuVar4 = __ctype_b_loc();
                if (((*ppuVar4)[(int)local_4f] & 0x800) != 0) {
                  local_34 = local_4f + -0x30;
                  bVar6 = true;
                }
              }
              else if (cVar1 == 'j') {
                ppuVar4 = __ctype_b_loc();
                if (((*ppuVar4)[(int)local_4f] & 0x800) != 0) {
                  local_38 = local_4f + -0x30;
                  bVar6 = true;
                }
              }
              else if ((((cVar1 == 'n') || (cVar1 == 'm')) || (cVar1 == 'l')) || (cVar1 == '#')) {
                local_3c = 0;
                bVar6 = false;
                ppuVar4 = __ctype_b_loc();
                if (((*ppuVar4)[(int)local_4f] & 0x800) != 0) {
                  bVar6 = true;
                  while( true ) {
                    bVar5 = false;
                    if (local_58 < 8) {
                      ppuVar4 = __ctype_b_loc();
                      bVar5 = ((*ppuVar4)[(int)local_4f] & 0x800) != 0;
                    }
                    if (!bVar5) break;
                    local_3c = local_3c * 10 + local_4f + -0x30;
                    local_58 = local_58 + 1;
                    local_4f = in_RDI[local_58];
                  }
                  local_58 = local_58 + -1;
                  if ((cVar1 == 'n') || (cVar1 == 'm')) {
                    if ((local_3c < 1) || (999 < local_3c)) {
                      bVar6 = false;
                    }
                    else {
                      if (local_3c == *in_R9) {
                        local_3c = 1;
                      }
                      else if (local_3c == in_R9[1]) {
                        local_3c = 2;
                      }
                      else if (local_3c == in_R9[2]) {
                        local_3c = 3;
                      }
                      else {
                        bVar6 = local_3c != in_R9[3];
                        if (bVar6) {
                          local_3c = 0;
                        }
                        else {
                          local_3c = 4;
                        }
                        bVar6 = !bVar6;
                      }
                      if (cVar1 == 'n') {
                        local_44 = local_3c;
                      }
                      else {
                        local_48 = local_3c;
                      }
                    }
                  }
                  else if (cVar1 == 'l') {
                    local_4c = local_3c;
                  }
                }
              }
              else if (cVar1 == 'a') {
                ppuVar4 = __ctype_b_loc();
                if ((((*ppuVar4)[(int)local_4f] & 0x100) != 0) || (local_4f == ' ')) {
                  bVar6 = true;
                  local_4d = local_4f;
                }
              }
              else if (cVar1 == '?') {
                bVar6 = true;
              }
              else {
                bVar6 = local_4f == cVar1;
              }
              if (!bVar6) break;
              local_54 = local_54 + 1;
              bVar3 = false;
            }
            if ((bVar6) && ((7 < local_58 || (in_RDI[local_58] == ' ')))) break;
          }
        }
        if (in_stack_00000010 != (int *)0x0) {
          *in_stack_00000010 = local_34;
        }
        if (_pass != (int *)0x0) {
          *_pass = local_38;
        }
        if (_ic != (int *)0x0) {
          *_ic = local_44;
        }
        if (_s != (int *)0x0) {
          *_s = local_48;
        }
        if (_mval != (int *)0x0) {
          *_mval = local_4c;
        }
        if (spat != (char *)0x0) {
          *(int *)spat = local_5c;
        }
        pcVar2 = *(char **)(in_RDX + (long)local_5c * 0x10 + 8);
        if (((bVar6) && (*pcVar2 != '\0')) && (*pcVar2 != '-')) {
          strcpy(in_RSI,in_RDI);
          if (*pcVar2 == '+') {
            local_4 = 0;
          }
          else {
            local_58 = 0;
            for (local_54 = 0; pcVar2[local_54] != '\0'; local_54 = local_54 + 1) {
              cVar1 = pcVar2[local_54];
              if (cVar1 == 'i') {
                in_RSI[local_58] = (char)local_34 + '0';
              }
              else if (cVar1 == 'j') {
                in_RSI[local_58] = (char)local_38 + '0';
              }
              else if ((cVar1 == 'n') && (local_44 != 0)) {
                for (local_40 = 1; 0 < local_44 / local_40; local_40 = local_40 * 10) {
                }
                while (local_40 = local_40 / 10, 0 < local_40) {
                  in_RSI[local_58] =
                       (char)((long)((ulong)(uint)((int)((long)local_44 / (long)local_40) >> 0x1f)
                                     << 0x20 | (long)local_44 / (long)local_40 & 0xffffffffU) % 10)
                       + '0';
                  local_58 = local_58 + 1;
                }
                local_58 = local_58 + -1;
              }
              else if ((cVar1 == 'm') && (local_48 != 0)) {
                for (local_40 = 1; 0 < local_48 / local_40; local_40 = local_40 * 10) {
                }
                while (local_40 = local_40 / 10, 0 < local_40) {
                  in_RSI[local_58] =
                       (char)((long)((ulong)(uint)((int)((long)local_48 / (long)local_40) >> 0x1f)
                                     << 0x20 | (long)local_48 / (long)local_40 & 0xffffffffU) % 10)
                       + '0';
                  local_58 = local_58 + 1;
                }
                local_58 = local_58 + -1;
              }
              else if ((cVar1 == 'l') && (-1 < local_4c)) {
                for (local_40 = 1; 0 < local_4c / local_40; local_40 = local_40 * 10) {
                }
                while (local_40 = local_40 / 10, 0 < local_40) {
                  in_RSI[local_58] =
                       (char)((long)((ulong)(uint)((int)((long)local_4c / (long)local_40) >> 0x1f)
                                     << 0x20 | (long)local_4c / (long)local_40 & 0xffffffffU) % 10)
                       + '0';
                  local_58 = local_58 + 1;
                }
                local_58 = local_58 + -1;
              }
              else if (cVar1 == 'a') {
                in_RSI[local_58] = local_4d;
              }
              else {
                in_RSI[local_58] = cVar1;
              }
              local_58 = local_58 + 1;
            }
            for (; local_58 < 8; local_58 = local_58 + 1) {
              in_RSI[local_58] = ' ';
            }
            local_4 = *_fac;
          }
        }
        else {
          local_4 = 0;
        }
      }
    }
  }
  else {
    local_4 = *_fac;
  }
  return local_4;
}

Assistant:

int fits_translate_pixkeyword(
      char *inrec,        /* I - input string */
      char *outrec,       /* O - output converted string, or */
                          /*     a null string if input does not  */
                          /*     match any of the patterns */
      char *patterns[][2],/* I - pointer to input / output string */
                          /*     templates */
      int npat,           /* I - number of templates passed */
      int naxis,          /* I - number of columns to be binned */
      int *colnum,       /* I - numbers of the columns to be binned */
      int *pat_num,       /* O - matched pattern number (0 based) or -1 */
      int *i,
      int *j,
      int *n,
      int *m,
      int *l,
      int *status)        /* IO - error status */
      
/* 

Translate a keyword name to a new name, based on a set of patterns.
The user passes an array of patterns to be matched.  Input pattern
number i is pattern[i][0], and output pattern number i is
pattern[i][1].  Keywords are matched against the input patterns.  If a
match is found then the keyword is re-written according to the output
pattern.

Order is important.  The first match is accepted.  The fastest match
will be made when templates with the same first character are grouped
together.

Several characters have special meanings:

     i,j - single digits, preserved in output template
     n, m - column number of one or more digits, preserved in output template
     k - generic number of one or more digits, preserved in output template
     a - coordinate designator, preserved in output template
     # - number of one or more digits
     ? - any character
     * - only allowed in first character position, to match all
         keywords; only useful as last pattern in the list

i, j, n, and m are returned by the routine.

For example, the input pattern "iCTYPn" will match "1CTYP5" (if n_value
is 5); the output pattern "CTYPEi" will be re-written as "CTYPE1".
Notice that "i" is preserved.

The following output patterns are special

Special output pattern characters:

    "-" - do not copy a keyword that matches the corresponding input pattern

    "+" - copy the input unchanged

The inrec string could be just the 8-char keyword name, or the entire 
80-char header record.  Characters 9 = 80 in the input string simply get
appended to the translated keyword name.

If n_range = 0, then only keywords with 'n' equal to n_value will be 
considered as a pattern match.  If n_range = +1, then all values of 
'n' greater than or equal to n_value will be a match, and if -1, 
then values of 'n' less than or equal to n_value will match.

*/

{
    int i1 = 0, j1 = 0, val;
    int fac, nval = 0, mval = 0, lval = 0;
    char a = ' ';
    char oldp;
    char c, s;
    int ip, ic, pat, pass = 0, firstfail;
    char *spat;

    if (*status > 0)
        return(*status);

    if ((inrec == 0) || (outrec == 0)) 
      return (*status = NULL_INPUT_PTR);

    *outrec = '\0';
    if (*inrec == '\0') return 0;

    oldp = '\0';
    firstfail = 0;

    /* ===== Pattern match stage */
    for (pat=0; pat < npat; pat++) {

      spat = patterns[pat][0];
      
      i1 = 0; j1 = 0;   a = ' ';  /* Initialize the place-holders */
      pass = 0;
      
      /* Pass the wildcard pattern */
      if (spat[0] == '*') { 
	pass = 1;
	break;
      }
      
      /* Optimization: if we have seen this initial pattern character before,
	 then it must have failed, and we can skip the pattern */
      if (firstfail && spat[0] == oldp) continue;
      oldp = spat[0];

      /* 
	 ip = index of pattern character being matched
	 ic = index of keyname character being matched
	 firstfail = 1 if we fail on the first characteor (0=not)
      */
      
      for (ip=0, ic=0, firstfail=1;
	   (spat[ip]) && (ic < 8);
	   ip++, ic++, firstfail=0) {
	c = inrec[ic];
	s = spat[ip];

	if (s == 'i') {
	  /* Special pattern: 'i' placeholder */
	  if (isdigit(c)) { i1 = c - '0'; pass = 1;}
	} else if (s == 'j') {
	  /* Special pattern: 'j' placeholder */
	  if (isdigit(c)) { j1 = c - '0'; pass = 1;}
	} else if ((s == 'n')||(s == 'm')||(s == 'l')||(s == '#')) {
	  /* Special patterns: multi-digit number */
          val = 0;
	  pass = 0;
	  if (isdigit(c)) {
	    pass = 1;  /* NOTE, could fail below */
	    
	    /* Parse decimal number */
	    while (ic<8 && isdigit(c)) { 
	      val = val*10 + (c - '0');
	      ic++; c = inrec[ic];
	    }
	    ic--; c = inrec[ic];

	    if (s == 'n' || s == 'm') { 
	      
	      /* Is it a column number? */
	      if ( val >= 1 && val <= 999) {
	         
		 if (val == colnum[0])
		     val = 1; 
		 else if (val == colnum[1]) 
		     val = 2; 
		 else if (val == colnum[2]) 
		     val = 3; 
		 else if (val == colnum[3]) 
		     val = 4; 
		 else {
		     pass = 0;
		     val = 0; 
		 }

	         if (s == 'n')
		    nval = val;
		 else
		    mval = val;
 
              } else {
		  pass = 0;
              }
	    } else if (s == 'l') {
	      /* Generic number */
	      lval = val; 
	    }
	  }
	} else if (s == 'a') {
	  /* Special pattern: coordinate designator */
	  if (isupper(c) || c == ' ') { a = c; pass = 1;} 
	} else if (s == '?') {
	  /* Match any individual character */
	  pass = 1;
	} else if (c == s) {
	  /* Match a specific character */
	  pass = 1;
	} else {
	  /* FAIL */
	  pass = 0;
	}
	
	if (!pass) break;
      }
      

      /* Must pass to the end of the keyword.  No partial matches allowed */
      if (pass && (ic >= 8 || inrec[ic] == ' ')) break;
    }


    /* Transfer the pattern-matched numbers to the output parameters */
    if (i) { *i = i1; }
    if (j) { *j = j1; }
    if (n) { *n = nval; }
    if (m) { *m = mval; }
    if (l) { *l = lval; }
    if (pat_num) { *pat_num = pat; }

    /* ===== Keyword rewriting and output stage */
    spat = patterns[pat][1];

    /* Return case: no match, or explicit deletion pattern */
    if (pass == 0 || spat[0] == '\0' || spat[0] == '-') return 0;

    /* A match: we start by copying the input record to the output */
    strcpy(outrec, inrec);

    /* Return case: return the input record unchanged */
    if (spat[0] == '+') return 0;

    /* Final case: a new output pattern */
    for (ip=0, ic=0; spat[ip]; ip++, ic++) {
      s = spat[ip];
      if (s == 'i') {
	outrec[ic] = (i1+'0');
      } else if (s == 'j') {
	outrec[ic] = (j1+'0');
      } else if (s == 'n' && nval > 0) {
	  for (fac = 1; (nval/fac) > 0; fac *= 10);
	  fac /= 10;
	  while(fac > 0) {
	    outrec[ic] = ((nval/fac) % 10) + '0';
	    fac /= 10;
	    ic ++;
	  }
	  ic--;
      } else if (s == 'm' && mval > 0) {
	  for (fac = 1; (mval/fac) > 0; fac *= 10);
	  fac /= 10;
	  while(fac > 0) {
	    outrec[ic] = ((mval/fac) % 10) + '0';
	    fac /= 10;
	    ic ++;
	  }
	  ic--;
      } else if (s == 'l' && lval >= 0) {
	for (fac = 1; (lval/fac) > 0; fac *= 10);
	fac /= 10;
	while(fac > 0) {
	  outrec[ic] = ((lval/fac) % 10) + '0';
	  fac /= 10;
	  ic ++;
	}
	ic --;
      } else if (s == 'a') {
	outrec[ic] = a;
      } else {
	outrec[ic] = s;
      }
    }

    /* Pad the keyword name with spaces */
    for ( ; ic<8; ic++) { outrec[ic] = ' '; }

    return(*status);
}